

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

char * kj::_::fillLimited<kj::StringPtr,kj::ArrayPtr<char>,kj::StringPtr&>
                 (char *target,char *limit,StringPtr *first,ArrayPtr<char> *rest,StringPtr *rest_1)

{
  char *target_00;
  size_t sVar1;
  char *pcVar2;
  long lVar3;
  
  pcVar2 = (first->content).ptr;
  sVar1 = (first->content).size_;
  lVar3 = 0;
  while( true ) {
    target_00 = target + lVar3;
    if (sVar1 - 1 == lVar3) {
      pcVar2 = fillLimited<kj::ArrayPtr<char>,kj::StringPtr&>(target_00,limit,rest,rest_1);
      return pcVar2;
    }
    if (target_00 == limit) break;
    *target_00 = pcVar2[lVar3];
    lVar3 = lVar3 + 1;
  }
  return target_00;
}

Assistant:

inline constexpr const T* end() const { return ptr + size_; }